

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# cmCTestLaunch.cxx
# Opt level: O3

void __thiscall
cmCTestLaunch::LoadScrapeRules
          (cmCTestLaunch *this,char *purpose,
          vector<cmsys::RegularExpression,_std::allocator<cmsys::RegularExpression>_> *regexps)

{
  pointer pcVar1;
  bool bVar2;
  string fname;
  string line;
  RegularExpression rex;
  ifstream fin;
  long *local_348 [2];
  long local_338 [2];
  string local_328;
  RegularExpression local_308;
  istream local_238 [520];
  
  pcVar1 = (this->LogDir)._M_dataplus._M_p;
  local_348[0] = local_338;
  std::__cxx11::string::_M_construct<char*>
            ((string *)local_348,pcVar1,pcVar1 + (this->LogDir)._M_string_length);
  std::__cxx11::string::append((char *)local_348);
  std::__cxx11::string::append((char *)local_348);
  std::__cxx11::string::append((char *)local_348);
  std::ifstream::ifstream(local_238,(char *)local_348[0],_S_in|_S_bin);
  local_328._M_string_length = 0;
  local_328.field_2._M_local_buf[0] = '\0';
  local_308.regmatch.startp[0] = (char *)0x0;
  local_308.regmatch.endp[0] = (char *)0x0;
  local_308.regmatch.searchstring = (char *)0x0;
  local_308.program = (char *)0x0;
  local_328._M_dataplus._M_p = (pointer)&local_328.field_2;
  while( true ) {
    bVar2 = cmsys::SystemTools::GetLineFromStream(local_238,&local_328,(bool *)0x0,-1);
    if (!bVar2) break;
    bVar2 = cmsys::RegularExpression::compile(&local_308,local_328._M_dataplus._M_p);
    if (bVar2) {
      std::vector<cmsys::RegularExpression,_std::allocator<cmsys::RegularExpression>_>::push_back
                (regexps,&local_308);
    }
  }
  if (local_308.program != (char *)0x0) {
    operator_delete__(local_308.program);
  }
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_328._M_dataplus._M_p != &local_328.field_2) {
    operator_delete(local_328._M_dataplus._M_p,
                    CONCAT71(local_328.field_2._M_allocated_capacity._1_7_,
                             local_328.field_2._M_local_buf[0]) + 1);
  }
  std::ifstream::~ifstream(local_238);
  if (local_348[0] != local_338) {
    operator_delete(local_348[0],local_338[0] + 1);
  }
  return;
}

Assistant:

void cmCTestLaunch::LoadScrapeRules(
  const char* purpose, std::vector<cmsys::RegularExpression>& regexps)
{
  std::string fname = this->LogDir;
  fname += "Custom";
  fname += purpose;
  fname += ".txt";
  cmsys::ifstream fin(fname.c_str(), std::ios::in | std::ios::binary);
  std::string line;
  cmsys::RegularExpression rex;
  while (cmSystemTools::GetLineFromStream(fin, line)) {
    if (rex.compile(line)) {
      regexps.push_back(rex);
    }
  }
}